

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Material(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  pointer pcVar1;
  ParameterDictionary parameters;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  undefined1 in_stack_fffffffffffffe10 [80];
  FileLoc in_stack_fffffffffffffe60;
  ParameterDictionary local_188;
  SceneEntity local_120;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  if (this->currentBlock != OptionsBlock) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_80,in_RDX);
    ParameterDictionary::ParameterDictionary
              (&local_188,&local_80,&(this->graphicsState).materialAttributes,
               (this->graphicsState).colorSpace);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_80);
    ParameterDictionary::ParameterDictionary
              ((ParameterDictionary *)&stack0xfffffffffffffe10,&local_188);
    parameters.params.ptr = params.ptr;
    parameters.params.alloc =
         (polymorphic_allocator<pbrt::ParsedParameter_*>)
         (polymorphic_allocator<pbrt::ParsedParameter_*>)params.alloc.memoryResource;
    parameters.params.field_2.fixed[0] = params.field_2.fixed[0];
    parameters._24_80_ = in_stack_fffffffffffffe10;
    SceneEntity::SceneEntity(&local_120,name,parameters,in_stack_fffffffffffffe60);
    std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::
    emplace_back<pbrt::SceneEntity>(&this->materials,&local_120);
    SceneEntity::~SceneEntity(&local_120);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)&stack0xfffffffffffffe10);
    pcVar1 = (this->graphicsState).currentMaterialName._M_dataplus._M_p;
    (this->graphicsState).currentMaterialIndex =
         (int)(((long)(this->materials).
                      super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->materials).
                     super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0xa0) + -1;
    (this->graphicsState).currentMaterialName._M_string_length = 0;
    *pcVar1 = '\0';
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_188.params);
    return;
  }
  ErrorExit<char_const(&)[9]>
            ((FileLoc *)&params,
             "Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [9])0x431c41);
}

Assistant:

void ParsedScene::Material(const std::string &name, ParsedParameterVector params,
                           FileLoc loc) {
    VERIFY_WORLD("Material");
    ParameterDictionary dict(std::move(params), graphicsState.materialAttributes,
                             graphicsState.colorSpace);
    materials.push_back(SceneEntity(name, std::move(dict), loc));
    graphicsState.currentMaterialIndex = materials.size() - 1;
    graphicsState.currentMaterialName.clear();
}